

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O2

int fS(int Ns,sunrealtype t,N_Vector y,N_Vector ydot,N_Vector *yS,N_Vector *ySdot,void *user_data,
      N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar1 = *(double *)((long)user_data + 8);
  pdVar7 = *(double **)((long)y->content + 0x10);
  dVar2 = *pdVar7;
  dVar3 = pdVar7[1];
  dVar4 = pdVar7[2];
  pdVar7 = *(double **)((long)(*yS)->content + 0x10);
  dVar5 = pdVar7[1];
  dVar6 = pdVar7[2];
  dVar9 = *user_data * -2.0 * dVar2;
  dVar10 = -dVar1 * dVar1 * dVar4;
  dVar11 = -dVar1 * dVar1 * dVar3;
  pdVar8 = *(double **)((long)(*ySdot)->content + 0x10);
  *pdVar8 = (*pdVar7 * dVar9 - dVar6) - dVar2 * dVar2;
  pdVar8[1] = -dVar5;
  pdVar8[2] = dVar10 * dVar5 + dVar6 * dVar11;
  pdVar7 = *(double **)((long)yS[1]->content + 0x10);
  dVar2 = pdVar7[1];
  dVar5 = pdVar7[2];
  pdVar8 = *(double **)((long)ySdot[1]->content + 0x10);
  *pdVar8 = dVar9 * *pdVar7 - dVar5;
  pdVar8[1] = -dVar2;
  pdVar8[2] = dVar1 * -2.0 * dVar3 * dVar4 + dVar10 * dVar2 + dVar11 * dVar5;
  return 0;
}

Assistant:

static int fS(int Ns, sunrealtype t, N_Vector y, N_Vector ydot, N_Vector* yS,
              N_Vector* ySdot, void* user_data, N_Vector tmp1, N_Vector tmp2)
{
  UserData data;
  sunrealtype y1, y2, y3;
  sunrealtype s1, s2, s3;
  sunrealtype fys1, fys2, fys3;
  sunrealtype p1, p2;

  data = (UserData)user_data;
  p1   = data->p1;
  p2   = data->p2;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  /* 1st sensitivity RHS */

  s1 = Ith(yS[0], 1);
  s2 = Ith(yS[0], 2);
  s3 = Ith(yS[0], 3);

  fys1 = -2.0 * p1 * y1 * s1 - s3;
  fys2 = -s2;
  fys3 = -p2 * p2 * y3 * s2 - p2 * p2 * y2 * s3;

  Ith(ySdot[0], 1) = fys1 - y1 * y1;
  Ith(ySdot[0], 2) = fys2;
  Ith(ySdot[0], 3) = fys3;

  /* 2nd sensitivity RHS */

  s1 = Ith(yS[1], 1);
  s2 = Ith(yS[1], 2);
  s3 = Ith(yS[1], 3);

  fys1 = -2.0 * p1 * y1 * s1 - s3;
  fys2 = -s2;
  fys3 = -p2 * p2 * y3 * s2 - p2 * p2 * y2 * s3;

  Ith(ySdot[1], 1) = fys1;
  Ith(ySdot[1], 2) = fys2;
  Ith(ySdot[1], 3) = fys3 - 2.0 * p2 * y2 * y3;

  return (0);
}